

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildSystem::BuildSystem
          (BuildSystem *this,BuildSystemDelegate *delegate,
          unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
          *fileSystem)

{
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  *delegate_00;
  BuildSystemImpl *this_00;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> local_28;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> *local_20
  ;
  unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  *fileSystem_local;
  BuildSystemDelegate *delegate_local;
  BuildSystem *this_local;
  
  local_20 = fileSystem;
  fileSystem_local =
       (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_> *)
       delegate;
  delegate_local = (BuildSystemDelegate *)this;
  this_00 = (BuildSystemImpl *)operator_new(0x138);
  delegate_00 = fileSystem_local;
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  unique_ptr(&local_28,fileSystem);
  anon_unknown.dwarf_60e82::BuildSystemImpl::BuildSystemImpl
            (this_00,this,(BuildSystemDelegate *)delegate_00,&local_28);
  std::unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>::
  ~unique_ptr(&local_28);
  this->impl = this_00;
  return;
}

Assistant:

BuildSystem::BuildSystem(BuildSystemDelegate& delegate, std::unique_ptr<basic::FileSystem> fileSystem)
  : impl(new BuildSystemImpl(*this, delegate, std::move(fileSystem)))
{
}